

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  undefined8 in_RAX;
  stbi_uc *psVar2;
  long lVar3;
  stbi_uc *psVar4;
  char *pcVar5;
  stbi_uc *psVar6;
  stbi_uc sVar7;
  stbi_uc sVar8;
  stbi_uc *psVar9;
  long *in_FS_OFFSET;
  char c;
  undefined8 uStack_38;
  
  psVar4 = s->img_buffer_original;
  psVar2 = s->img_buffer_original_end;
  s->img_buffer = psVar4;
  s->img_buffer_end = psVar2;
  uStack_38 = in_RAX;
  if (psVar4 < psVar2) {
    s->img_buffer = psVar4 + 1;
    sVar7 = *psVar4;
    psVar9 = psVar4 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar7 = '\0';
    psVar9 = psVar4;
  }
  else {
    psVar9 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
    psVar4 = s->img_buffer_original;
    s->callback_already_read = s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar4);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar7 = '\0';
    }
    else {
      psVar2 = psVar9 + iVar1;
      sVar7 = *psVar9;
    }
    s->img_buffer_end = psVar2;
    s->img_buffer = s->buffer_start + 1;
    psVar9 = s->buffer_start + 1;
  }
  if (psVar9 < psVar2) {
    psVar6 = psVar9 + 1;
    s->img_buffer = psVar6;
    sVar8 = *psVar9;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_004393ee;
    psVar9 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
    psVar4 = s->img_buffer_original;
    s->callback_already_read = s->callback_already_read + (*(int *)&s->img_buffer - (int)psVar4);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar8 = '\0';
    }
    else {
      psVar2 = psVar9 + iVar1;
      sVar8 = *psVar9;
    }
    s->img_buffer_end = psVar2;
    psVar6 = s->buffer_start + 1;
    s->img_buffer = psVar6;
  }
  if ((sVar7 != 'P') || ((byte)(sVar8 - 0x37) < 0xfe)) {
LAB_004393ee:
    s->img_buffer = psVar4;
    s->img_buffer_end = s->img_buffer_original_end;
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = (uint)(sVar8 == '6') * 2 + 1;
  }
  if (psVar6 < psVar2) {
    s->img_buffer = psVar6 + 1;
    sVar7 = *psVar6;
  }
  else if (s->read_from_callbacks == 0) {
    sVar7 = '\0';
  }
  else {
    psVar2 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
    s->callback_already_read =
         s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar4 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar7 = '\0';
    }
    else {
      psVar4 = psVar2 + iVar1;
      sVar7 = *psVar2;
    }
    s->img_buffer_end = psVar4;
    s->img_buffer = s->buffer_start + 1;
  }
  uStack_38 = CONCAT17(sVar7,(undefined7)uStack_38);
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar1 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (x != (int *)0x0) {
    *x = iVar1;
  }
  if (iVar1 != 0) {
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
    iVar1 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
    if (y != (int *)0x0) {
      *y = iVar1;
    }
    if (iVar1 != 0) {
      stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
      iVar1 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
      if (iVar1 < 0x10000) {
        return (uint)(0xff < iVar1) * 8 + 8;
      }
      lVar3 = *in_FS_OFFSET;
      pcVar5 = "max value > 65535";
      goto LAB_00439504;
    }
  }
  lVar3 = *in_FS_OFFSET;
  pcVar5 = "invalid width";
LAB_00439504:
  *(char **)(lVar3 + -8) = pcVar5;
  return 0;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   if(*x == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   if (*y == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value
   if (maxv > 65535)
      return stbi__err("max value > 65535", "PPM image supports only 8-bit and 16-bit images");
   else if (maxv > 255)
      return 16;
   else
      return 8;
}